

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall atoiTest_testInvalidChars_Test::TestBody(atoiTest_testInvalidChars_Test *this)

{
  allocator local_29;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"",&local_29);
  test<long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28," ",&local_29);
  test<long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"  ",&local_29);
  test<long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"1a",&local_29);
  test<long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"11234b",&local_29);
  test<long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"1 ",&local_29);
  test<long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"1234 ",&local_29);
  test<long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"-",&local_29);
  test<long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"+",&local_29);
  test<long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"- ",&local_29);
  test<long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"+ ",&local_29);
  test<long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"-11234a",&local_29);
  test<long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"-11234 ",&local_29);
  test<long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"o",&local_29);
  test<long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"ooooo",&local_29);
  test<long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"1A2B3C",&local_29);
  test<long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"aaaaa14453",&local_29);
  test<long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"02a",&local_29);
  test<long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

TEST(atoiTest, testInvalidChars) {
  test<int64_t>(false, ""); 
  test<int64_t>(false, " "); 
  test<int64_t>(false, "  "); 
  test<int64_t>(false, "1a"); 
  test<int64_t>(false, "11234b"); 
  test<int64_t>(false, "1 "); 
  test<int64_t>(false, "1234 "); 
  test<int64_t>(false, "-"); 
  test<int64_t>(false, "+"); 
  test<int64_t>(false, "- "); 
  test<int64_t>(false, "+ "); 
  test<int64_t>(false, "-11234a"); 
  test<int64_t>(false, "-11234 "); 
  test<int64_t>(false, "o"); 
  test<int64_t>(false, "ooooo"); 
  test<int64_t>(false, "1A2B3C"); 
  test<int64_t>(false, "aaaaa14453"); 
  test<int64_t>(false, "02a"); 
}